

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  uint *puVar8;
  int local_34;
  int nWords;
  int w;
  int i;
  int k;
  uint *pInfo;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *pAig_local;
  Vec_Ptr_t *vInfo_local;
  
  if (pCex->nBits != pCex->nRegs + pCex->nPis * (pCex->iFrame + 1)) {
    __assert_fail("pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSeq.c"
                  ,0x31,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
  }
  iVar3 = pCex->nBits;
  iVar4 = pCex->nRegs;
  iVar1 = Gia_ManRegNum(pAig);
  iVar2 = Vec_PtrSize(vInfo);
  if ((iVar3 - iVar4) + iVar1 <= iVar2) {
    iVar3 = Vec_PtrReadWordsSimInfo(vInfo);
    w = 0;
    while ((w < pCex->nRegs && (iVar4 = Abc_InfoHasBit((uint *)(pCex + 1),w), iVar4 == 0))) {
      w = w + 1;
    }
    if (w < pCex->nRegs) {
      Abc_Print(0,
                "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n"
               );
    }
    for (w = 0; iVar4 = Gia_ManRegNum(pAig), w < iVar4; w = w + 1) {
      pvVar7 = Vec_PtrEntry(vInfo,w);
      for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
        *(undefined4 *)((long)pvVar7 + (long)local_34 * 4) = 0;
      }
    }
    for (nWords = pCex->nRegs; nWords < pCex->nBits; nWords = nWords + 1) {
      puVar8 = (uint *)Vec_PtrEntry(vInfo,w);
      for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
        uVar5 = Gia_ManRandom(0);
        puVar8[local_34] = uVar5;
      }
      uVar5 = *puVar8;
      uVar6 = Abc_InfoHasBit((uint *)(pCex + 1),nWords);
      *puVar8 = uVar5 << 1 | uVar6;
      *puVar8 = *puVar8 << 1;
      w = w + 1;
    }
    for (; iVar4 = Vec_PtrSize(vInfo), w < iVar4; w = w + 1) {
      pvVar7 = Vec_PtrEntry(vInfo,w);
      for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
        uVar5 = Gia_ManRandom(0);
        *(uint *)((long)pvVar7 + (long)local_34 * 4) = uVar5;
      }
    }
    return;
  }
  __assert_fail("pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSeq.c"
                ,0x32,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sets register values from the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_ManSeqDeriveInfoFromCex( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, i, w, nWords;
    assert( pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1) );
    assert( pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
/*
    // user register values
    assert( pCex->nRegs == Gia_ManRegNum(pAig) );
    for ( k = 0; k < pCex->nRegs; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Abc_InfoHasBit( pCex->pData, k )? ~0 : 0;
    }
*/
    // print warning about register values
    for ( k = 0; k < pCex->nRegs; k++ )
        if ( Abc_InfoHasBit( pCex->pData, k ) )
            break;
    if ( k < pCex->nRegs )
        Abc_Print( 0, "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n" );

    // assign zero register values
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k++ );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
        // set simulation pattern and make sure it is second (first will be erased during simulation)
        pInfo[0] = (pInfo[0] << 1) | Abc_InfoHasBit( pCex->pData, i ); 
        pInfo[0] <<= 1;
    }
    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
    }
}